

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,mrg5s *R)

{
  delim_c dVar1;
  bool bVar2;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var3;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *this;
  delim_str P;
  int *in_RSI;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_00;
  delim_str *in_stack_ffffffffffffff98;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  mrg_status<int,_5,_trng::mrg5s> local_38;
  mrg_parameter<int,_5,_trng::mrg5s> local_24;
  int *local_10;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_5,_trng::mrg5s>::mrg_parameter(&local_24);
  mrg_status<int,_5,_trng::mrg5s>::mrg_status(&local_38);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var3 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var3);
  in_00 = local_8;
  utility::ignore_spaces();
  utility::operator>>(in_00,(ignore_spaces_cl *)this);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  mrg5s::name();
  P = utility::delim((char *)this);
  utility::operator>>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
             CONCAT44(__fmtfl,CONCAT22(in_stack_ffffffffffffffc2,
                                       CONCAT11(dVar1.c,in_stack_ffffffffffffffc0))),
             (mrg_parameter<int,_5,_trng::mrg5s> *)P.str);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
             CONCAT44(__fmtfl,CONCAT22(in_stack_ffffffffffffffc2,
                                       CONCAT11(dVar1.c,in_stack_ffffffffffffffc0))),
             (mrg_status<int,_5,_trng::mrg5s> *)P.str);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar2 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar2) {
    *(undefined8 *)local_10 = local_24.a._0_8_;
    *(undefined8 *)(local_10 + 2) = local_24.a._8_8_;
    local_10[4] = local_24.a[4];
    *(undefined8 *)(local_10 + 5) = local_38.r._0_8_;
    *(undefined8 *)(local_10 + 7) = local_38.r._8_8_;
    local_10[9] = local_38.r[4];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg5s &R) {
      mrg5s::parameter_type P_new;
      mrg5s::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg5s::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }